

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_append(Curl_easy *data)

{
  FILEPROTO *pFVar1;
  CURLcode CVar2;
  char *pcVar3;
  curl_off_t cVar4;
  char *mailbox;
  IMAP *imap;
  CURLcode result;
  Curl_easy *data_local;
  
  pFVar1 = (data->req).p.file;
  if (pFVar1->freepath == (char *)0x0) {
    Curl_failf(data,"Cannot APPEND without a mailbox.");
    data_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    if ((data->set).mimepost.kind == MIMEKIND_NONE) {
      CVar2 = Curl_creader_set_fread(data,(data->state).infilesize);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
    }
    else {
      (data->set).mimepost.flags = (data->set).mimepost.flags & 0xfffffffd;
      curl_mime_headers(&(data->set).mimepost,(data->set).headers,0);
      imap._4_4_ = Curl_mime_prepare_headers
                             (data,&(data->set).mimepost,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if ((imap._4_4_ == CURLE_OK) &&
         (pcVar3 = Curl_checkheaders(data,"Mime-Version",0xc), pcVar3 == (char *)0x0)) {
        imap._4_4_ = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0");
      }
      if (imap._4_4_ == CURLE_OK) {
        imap._4_4_ = Curl_creader_set_mime(data,&(data->set).mimepost);
      }
      if (imap._4_4_ != CURLE_OK) {
        return imap._4_4_;
      }
      cVar4 = Curl_creader_client_length(data);
      (data->state).infilesize = cVar4;
    }
    if ((data->state).infilesize < 0) {
      Curl_failf(data,"Cannot APPEND with unknown input file size");
      data_local._4_4_ = CURLE_UPLOAD_FAILED;
    }
    else {
      pcVar3 = imap_atom(pFVar1->freepath,false);
      if (pcVar3 == (char *)0x0) {
        data_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        data_local._4_4_ =
             imap_sendf(data,"APPEND %s (\\Seen) {%ld}",pcVar3,(data->state).infilesize);
        (*Curl_cfree)(pcVar3);
        if (data_local._4_4_ == CURLE_OK) {
          imap_state(data,IMAP_APPEND);
        }
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode imap_perform_append(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = data->req.p.imap;
  char *mailbox;

  /* Check we have a mailbox */
  if(!imap->mailbox) {
    failf(data, "Cannot APPEND without a mailbox.");
    return CURLE_URL_MALFORMAT;
  }

#ifndef CURL_DISABLE_MIME
  /* Prepare the mime data if some. */
  if(data->set.mimepost.kind != MIMEKIND_NONE) {
    /* Use the whole structure as data. */
    data->set.mimepost.flags &= ~(unsigned int)MIME_BODY_ONLY;

    /* Add external headers and mime version. */
    curl_mime_headers(&data->set.mimepost, data->set.headers, 0);
    result = Curl_mime_prepare_headers(data, &data->set.mimepost, NULL,
                                       NULL, MIMESTRATEGY_MAIL);

    if(!result)
      if(!Curl_checkheaders(data, STRCONST("Mime-Version")))
        result = Curl_mime_add_header(&data->set.mimepost.curlheaders,
                                      "Mime-Version: 1.0");

    if(!result)
      result = Curl_creader_set_mime(data, &data->set.mimepost);
    if(result)
      return result;
    data->state.infilesize = Curl_creader_client_length(data);
  }
  else
#endif
  {
    result = Curl_creader_set_fread(data, data->state.infilesize);
    if(result)
      return result;
  }

  /* Check we know the size of the upload */
  if(data->state.infilesize < 0) {
    failf(data, "Cannot APPEND with unknown input file size");
    return CURLE_UPLOAD_FAILED;
  }

  /* Make sure the mailbox is in the correct atom format */
  mailbox = imap_atom(imap->mailbox, FALSE);
  if(!mailbox)
    return CURLE_OUT_OF_MEMORY;

  /* Send the APPEND command */
  result = imap_sendf(data, "APPEND %s (\\Seen) {%" FMT_OFF_T "}",
                      mailbox, data->state.infilesize);

  free(mailbox);

  if(!result)
    imap_state(data, IMAP_APPEND);

  return result;
}